

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vInputs)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  uint uVar7;
  Vec_Wrd_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar8;
  ulong uVar9;
  int Fill;
  ulong uVar10;
  word *pwVar11;
  
  pAVar3 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,(int)vInputs);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] == iVar2) {
    return;
  }
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
  if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar4->vTravIds).pArray[iVar1] = iVar2;
  uVar6 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar6 == 2) {
    return;
  }
  if (uVar6 == 5) {
    return;
  }
  if (uVar6 != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                  ,0x121,
                  "void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)");
  }
  __ptr = Abc_NtkShareSuperAnd(pObj,&p->nFoundGates);
  uVar6 = __ptr->nSize;
  if ((int)uVar6 < 2) {
    if (uVar6 == 1) {
LAB_002c503d:
      pwVar11 = __ptr->pArray;
      uVar10 = 0;
      do {
        uVar9 = pwVar11[uVar10];
        uVar7 = (uint)uVar9;
        if (((int)uVar7 < 0) || (vInputs->nSize <= (int)uVar7)) goto LAB_002c51c0;
        p_00 = (Vec_Int_t *)vInputs->pArray[uVar7 & 0x7fffffff];
        if (p_00 == (Vec_Int_t *)0x0) {
          p_00 = (Vec_Int_t *)malloc(0x10);
          p_00->nCap = 0x10;
          p_00->nSize = 0;
          piVar8 = (int *)malloc(0x40);
          p_00->pArray = piVar8;
          Vec_IntPush(p_00,uVar7);
          uVar9 = uVar9 >> 1 & 0x7fffffff;
          pVVar5 = p->pNtk->vObjs;
          if (pVVar5->nSize <= (int)uVar9) goto LAB_002c51c0;
          Vec_IntPush(p_00,*(uint *)((long)pVVar5->pArray[uVar9] + 0x14) >> 0xc);
          if (p_00->nSize != 2) {
            __assert_fail("SHARE_NUM == Vec_IntSize(vInput)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                          ,0x12d,
                          "void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                         );
          }
          if (vInputs->nSize <= (int)uVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          vInputs->pArray[uVar7 & 0x7fffffff] = p_00;
        }
        Vec_IntPush(p_00,p->vObj2Lit->nSize);
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
    }
    iVar1 = *(int *)(((ulong)pObj & 0xfffffffffffffffe) + 0x10);
    if (iVar1 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(p->vObj2Lit,((uint)pObj & 1) + iVar1 * 2);
    if (0 < (int)uVar6) goto LAB_002c514d;
    pwVar11 = __ptr->pArray;
    if (pwVar11 == (word *)0x0) goto LAB_002c519a;
  }
  else {
    if (p->nMultiSize <= (int)uVar6) goto LAB_002c503d;
LAB_002c514d:
    pwVar11 = __ptr->pArray;
    uVar10 = 0;
    do {
      if ((int)(uint)pwVar11[uVar10] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar7 = (uint)pwVar11[uVar10] >> 1;
      pVVar5 = p->pNtk->vObjs;
      if (pVVar5->nSize <= (int)uVar7) {
LAB_002c51c0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_NtkTraverseSupersAnd_rec(p,(Abc_Obj_t *)pVVar5->pArray[uVar7],vInputs);
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
  }
  free(pwVar11);
LAB_002c519a:
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkTraverseSupersAnd_rec( Abc_ShaMan_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vInputs )
{
    Vec_Wrd_t * vSuper;
    word Num;
    int k;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
    vSuper = Abc_NtkShareSuperAnd( pObj, &p->nFoundGates );
    if ( Vec_WrdSize(vSuper) <= 1 || Vec_WrdSize(vSuper) >= p->nMultiSize )
    {
        Vec_WrdForEachEntry( vSuper, Num, k )
        {
            Vec_Int_t * vInput = (Vec_Int_t *)Vec_PtrEntry( vInputs, (int)Num );
            if ( vInput == NULL )
            {
                vInput = Vec_IntAlloc( 10 );
                Vec_IntPush( vInput, (int)Num );
                Vec_IntPush( vInput, Abc_ObjLevel(Abc_NtkObj(p->pNtk, Abc_Lit2Var((int)Num))) );
                assert( SHARE_NUM == Vec_IntSize(vInput) );
                Vec_PtrWriteEntry( vInputs, (int)Num, vInput );
            }
            Vec_IntPush( vInput, Vec_IntSize(p->vObj2Lit) );
        }
        Vec_IntPush( p->vObj2Lit, Abc_ObjToLit(pObj) );
    }
    // call recursively
    Vec_WrdForEachEntry( vSuper, Num, k )
        Abc_NtkTraverseSupersAnd_rec( p, Abc_NtkObj(p->pNtk, Abc_Lit2Var((int)Num)), vInputs );
    Vec_WrdFree( vSuper );
}